

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::TypedArrayBase::EntryFilter(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_24_3_e6d59889_for_newObjectCreationFunction newObjectCreationFunction;
  Var pvVar2;
  Var pvVar3;
  Var pvVar4;
  bool bVar5;
  int iVar6;
  CallFlags e;
  BOOL BVar7;
  uint uVar8;
  ScriptContext *pSVar9;
  ThreadContext *pTVar10;
  Var *values;
  undefined4 *puVar11;
  Var pvVar12;
  JavascriptLibrary *this;
  TempGuestArenaAllocatorObject *this_00;
  ArenaAllocator *alloc;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_01;
  undefined4 extraout_var;
  JavascriptMethod p_Var13;
  Var pvVar14;
  JavascriptFunction *defaultConstructor_00;
  JavascriptFunction *instanceObj;
  CallInfo obj;
  Type *ppvVar15;
  TypedArrayBase *local_2a0;
  uint local_158;
  uint local_154;
  uint32 i_1;
  uint32 i;
  TypedArrayBase *newArr;
  undefined4 uStack_13c;
  bool isDefaultConstructor;
  RecyclableObject *constructor;
  JavascriptFunction *defaultConstructor;
  CallInfo CStack_110;
  uint32 captured;
  CallInfo local_108;
  undefined1 local_100 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  uint32 k;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *tempList;
  ArenaAllocator *tempAlloc;
  TempGuestArenaAllocatorObject *tempGuesttempAlloc;
  RecyclableObject *newObj;
  Var selected;
  Var element;
  Var thisArg;
  RecyclableObject *callBackFn;
  TypedArrayBase *pTStack_a0;
  uint32 length;
  TypedArrayBase *typedArrayBase;
  RecyclableObject *local_88;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar9 = RecyclableObject::GetScriptContext(function);
  pTVar10 = ScriptContext::GetThreadContext(pSVar9);
  pSVar9 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar10,0xc00,pSVar9,(PVOID)0x0);
  iVar6 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar6);
  args.super_Arguments.Values = (Type)function_local;
  bVar5 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x69a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  local_88 = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)function_local,
             L"[TypedArray].prototype.filter",&stack0x00000000);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar5 = operator!(e);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x69e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pTStack_a0 = ValidateTypedArray((Arguments *)&scriptContext,(ScriptContext *)__tag.entry.next,
                                  L"[TypedArray].prototype.filter");
  callBackFn._4_4_ = ArrayObject::GetLength((ArrayObject *)pTStack_a0);
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar5 = JavascriptConversion::IsCallable(pvVar12);
    if (bVar5) {
      pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,1);
      thisArg = VarTo<Js::RecyclableObject>(pvVar12);
      element = (Var)0x0;
      if (((uint)scriptContext & 0xffffff) < 3) {
        this = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
        element = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      }
      else {
        element = Arguments::operator[]((Arguments *)&scriptContext,2);
      }
      selected = (Var)0x0;
      this_00 = ScriptContext::GetTemporaryGuestAllocator
                          ((ScriptContext *)__tag.entry.next,L"Runtime");
      alloc = TempArenaAllocatorWrapper<true>::GetAllocator(this_00);
      this_01 = JsUtil::
                List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
                New(alloc,4);
      for (autoReentrancyHandler._12_4_ = 0; (uint)autoReentrancyHandler._12_4_ < callBackFn._4_4_;
          autoReentrancyHandler._12_4_ = autoReentrancyHandler._12_4_ + 1) {
        iVar6 = (*(pTStack_a0->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])
                          (pTStack_a0,(ulong)(uint)autoReentrancyHandler._12_4_);
        selected = (Var)CONCAT44(extraout_var,iVar6);
        pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_100,pTVar10);
        pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar10);
        pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
        ThreadContext::AssertJsReentrancy(pTVar10);
        pvVar12 = thisArg;
        p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
        CheckIsExecutable((RecyclableObject *)pvVar12,p_Var13);
        p_Var13 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
        pvVar3 = thisArg;
        CallInfo::CallInfo(&local_108,CallFlags_Value,4);
        pvVar4 = thisArg;
        CallInfo::CallInfo(&stack0xfffffffffffffef0,CallFlags_Value,4);
        pvVar2 = element;
        pvVar12 = selected;
        pvVar14 = JavascriptNumber::ToVar
                            (autoReentrancyHandler._12_4_,(ScriptContext *)__tag.entry.next);
        pvVar12 = (*p_Var13)((RecyclableObject *)pvVar3,(CallInfo)pvVar4,local_108,0,0,0,0,
                             CStack_110,pvVar2,pvVar12,pvVar14,pTStack_a0);
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_100);
        BVar7 = JavascriptConversion::ToBoolean(pvVar12,(ScriptContext *)__tag.entry.next);
        if (BVar7 != 0) {
          JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(this_01,&selected);
        }
      }
      uVar8 = JsUtil::ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                        (&this_01->
                          super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>);
      pvVar12 = Arguments::operator[]((Arguments *)&scriptContext,0);
      defaultConstructor_00 = GetDefaultConstructor(pvVar12,(ScriptContext *)__tag.entry.next);
      instanceObj = (JavascriptFunction *)
                    Js::JavascriptOperators::SpeciesConstructor
                              ((RecyclableObject *)pTStack_a0,defaultConstructor_00,
                               (ScriptContext *)__tag.entry.next);
      bVar5 = Js::JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                    ,0x6dd,"(JavascriptOperators::IsConstructor(constructor))",
                                    "JavascriptOperators::IsConstructor(constructor)");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      pTVar10 = ScriptContext::GetThreadContext((ScriptContext *)__tag.entry.next);
      newObjectCreationFunction._12_4_ = uStack_13c;
      newObjectCreationFunction.captured = uVar8;
      newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
      newObjectCreationFunction.scriptContext = (ScriptContext *)__tag.entry.next;
      pvVar12 = Js::JavascriptOperators::
                NewObjectCreationHelper_ReentrancySafe<Js::TypedArrayBase::EntryFilter(Js::RecyclableObject*,Js::CallInfo,___)::__0>
                          ((RecyclableObject *)instanceObj,instanceObj == defaultConstructor_00,
                           pTVar10,newObjectCreationFunction);
      obj = (CallInfo)VarTo<Js::RecyclableObject>(pvVar12);
      callInfo_local = obj;
      bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)obj);
      if (bVar5) {
        local_2a0 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>
                              ((RecyclableObject *)callInfo_local);
      }
      else {
        local_2a0 = (TypedArrayBase *)0x0;
      }
      if (local_2a0 == (TypedArrayBase *)0x0) {
        for (local_158 = 0; local_158 < uVar8; local_158 = local_158 + 1) {
          ppvVar15 = JsUtil::
                     List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     ::Item(this_01,local_158);
          Js::JavascriptOperators::OP_SetElementI_UInt32
                    ((Var)obj,local_158,*ppvVar15,(ScriptContext *)__tag.entry.next,
                     PropertyOperation_ThrowIfNotExtensible);
        }
      }
      else {
        for (local_154 = 0; local_154 < uVar8; local_154 = local_154 + 1) {
          ppvVar15 = JsUtil::
                     List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     ::Item(this_01,local_154);
          (*(local_2a0->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(local_2a0,(ulong)local_154,*ppvVar15);
        }
      }
      if (this_00 != (TempGuestArenaAllocatorObject *)0x0) {
        ScriptContext::ReleaseTemporaryGuestAllocator((ScriptContext *)__tag.entry.next,this_00);
      }
      AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80);
      return (Var)obj;
    }
  }
  JavascriptError::ThrowTypeError
            ((ScriptContext *)__tag.entry.next,-0x7ff5ec34,L"[TypedArray].prototype.filter");
}

Assistant:

Var TypedArrayBase::EntryFilter(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].prototype.filter"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_filter);

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.filter"));
        uint32 length = typedArrayBase->GetLength();

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.filter"));
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        Var element = nullptr;
        Var selected = nullptr;
        RecyclableObject* newObj = nullptr;

        DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

        ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
        {
            // Create a temporary list to hold the items selected by the callback function.
            // We will then iterate over this list and append those items into the object we will return.
            // We have to collect the items into this temporary list because we need to call the
            // new object constructor with a length of items and we don't know what length will be
            // until we know how many items we will collect.
            JsUtil::List<Var, ArenaAllocator>* tempList = JsUtil::List<Var, ArenaAllocator>::New(tempAlloc);

            for (uint32 k = 0; k < length; k++)
            {
                // We know that the TypedArray.HasItem will be true because k < length and we can skip the check in the TypedArray version of filter.
                element = typedArrayBase->DirectGetItem(k);

                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    selected = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                    callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                    element,
                                    JavascriptNumber::ToVar(k, scriptContext),
                                    typedArrayBase);
                }
                END_SAFE_REENTRANT_CALL

                if (JavascriptConversion::ToBoolean(selected, scriptContext))
                {
                    tempList->Add(element);
                }
            }

            uint32 captured = tempList->Count();

            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext);
            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            newObj = VarTo<RecyclableObject>(JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
            {
                Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(captured, scriptContext) };
                Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), captured, scriptContext);
            }));

            TypedArrayBase* newArr = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
            if (newArr)
            {
                // We are much more likely to have a TypedArray here than anything else

                for (uint32 i = 0; i < captured; i++)
                {
                    newArr->DirectSetItem(i, tempList->Item(i));
                }
            }
            else
            {
                for (uint32 i = 0; i < captured; i++)
                {
                    JavascriptOperators::OP_SetElementI_UInt32(newObj, i, tempList->Item(i), scriptContext, PropertyOperation_ThrowIfNotExtensible);
                }
            }
        }
        RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);

        return newObj;
    }